

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O3

Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
yaml::Value::getFloat_abi_cxx11_
          (Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Value *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  size_type local_28;
  undefined8 uStack_20;
  
  if (this->type_ == String) {
    floatFromString(__return_storage_ptr__,&this->string_);
  }
  else {
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Value is not of String type cannot be parsed as Float","");
    if (local_58 == &local_48) {
      uStack_20 = uStack_40;
      local_58 = &local_28;
    }
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if (local_58 == &local_28) {
      paVar1->_M_allocated_capacity = local_48;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           uStack_20;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_58;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_48;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_50;
    __return_storage_ptr__->has_value_ = false;
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<float, std::string> getFloat() const {
		if (type_ != Type::String)
			return Unexpected<std::string>("Value is not of String type cannot be parsed as Float");

		return floatFromString(string_);
	}